

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_matrix_norm.c
# Opt level: O2

void __thiscall lu_matrix_norm(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double __x;
  
  uVar1 = *(uint *)((long)this + 0x54);
  uVar2 = *(uint *)((long)this + 0x13c);
  lVar11 = (long)(int)uVar2;
  lVar9 = *(long *)((long)this + 0x1d8);
  lVar5 = *(long *)((long)this + 0x1e8);
  lVar6 = *(long *)((long)this + 0x2a0);
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    *(undefined8 *)(lVar6 + uVar7 * 8) = 0;
  }
  uVar12 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  __x = 0.0;
  for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
    iVar3 = *(int *)(lVar9 + uVar12 * 4);
    iVar4 = Bend[iVar3];
    dVar13 = 0.0;
    for (lVar8 = (long)Bbegin[iVar3]; lVar8 < iVar4; lVar8 = lVar8 + 1) {
      dVar13 = dVar13 + ABS(Bx[lVar8]);
      *(double *)(lVar6 + (long)Bi[lVar8] * 8) =
           *(double *)(lVar6 + (long)Bi[lVar8] * 8) + ABS(Bx[lVar8]);
    }
    __x = fmax(__x,dVar13);
  }
  for (; lVar11 < (int)uVar1; lVar11 = lVar11 + 1) {
    lVar9 = (long)*(int *)(lVar5 + lVar11 * 4);
    *(double *)(lVar6 + lVar9 * 8) = *(double *)(lVar6 + lVar9 * 8) + 1.0;
    if (__x <= 1.0) {
      __x = 1.0;
    }
  }
  dVar13 = 0.0;
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    dVar13 = fmax(dVar13,*(double *)(lVar6 + uVar7 * 8));
  }
  *(double *)((long)this + 0x120) = __x;
  *(double *)((long)this + 0x128) = dVar13;
  return;
}

Assistant:

void lu_matrix_norm(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m          = this->m;
    const lu_int rank       = this->rank;
    const lu_int *pivotcol  = this->pivotcol;
    const lu_int *pivotrow  = this->pivotrow;
    double *rowsum          = this->work1;
    lu_int ipivot, jpivot, i, k, pos;
    double onenorm, infnorm, colsum;

    assert(this->nupdate == 0);

    for (i = 0; i < m; i++) rowsum[i] = 0;
    onenorm = 0;
    infnorm = 0;
    for (k = 0; k < rank; k++)
    {
        jpivot = pivotcol[k];
        colsum = 0;
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            colsum += fabs(Bx[pos]);
            rowsum[Bi[pos]] += fabs(Bx[pos]);
        }
        onenorm = fmax(onenorm, colsum);
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rowsum[ipivot] += 1;
        onenorm = fmax(onenorm, 1);
    }
    for (i = 0; i < m; i++) infnorm = fmax(infnorm, rowsum[i]);

    this->onenorm = onenorm;
    this->infnorm = infnorm;
}